

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O3

BasicBlock * __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CreateNewBlock
          (ReplaceDescArrayAccessUsingVarIndex *this)

{
  IRContext *pIVar1;
  uint32_t res_id;
  mapped_type pBVar2;
  Instruction *pIVar3;
  mapped_type *ppBVar4;
  string message;
  size_type __dnew;
  undefined1 local_68 [32];
  spv_position_t local_48;
  
  pBVar2 = (mapped_type)operator_new(0x88);
  pIVar3 = (Instruction *)operator_new(0x70);
  pIVar1 = (this->super_Pass).context_;
  res_id = Module::TakeNextIdBound
                     ((pIVar1->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((res_id == 0) && ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0))
  {
    local_68._0_8_ = local_68 + 0x10;
    local_48.line = 0x25;
    local_68._0_8_ = std::__cxx11::string::_M_create((ulong *)local_68,(ulong)&local_48);
    local_68._16_8_ = local_48.line;
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    _vptr_IntrusiveNodeBase = (_func_int **)0x667265766f204449;
    ((OperandData *)
    &(((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_)->
    _vptr_SmallVector = (_func_int **)0x797254202e776f6c;
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_
         = (Instruction *)0x676e696e6e757220;
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ =
         true;
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x19 =
         'c';
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1a =
         'o';
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1b =
         'm';
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1c =
         'p';
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1d =
         'a';
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1e =
         'c';
    (((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1f =
         't';
    *(undefined8 *)
     &(((key_type)local_68._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1d =
         0x2e7364692d746361;
    local_68._8_8_ = local_48.line;
    *(undefined1 *)
     ((long)&(((key_type)(local_68._0_8_ + -0x70))->dbg_line_insts_).
             super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_start +
     (long)(((OperandData *)(local_48.line + 8))->buffer + 2)) = 0;
    local_48.line = 0;
    local_48.column = 0;
    local_48.index = 0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",&local_48,(char *)local_68._0_8_);
    if ((key_type)local_68._0_8_ != (key_type)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_,
                      (ulong)((long)(spv_operand_type_t *)local_68._16_8_ + 1));
    }
  }
  local_68._0_8_ = (key_type)0x0;
  local_68._8_8_ = (pointer)0x0;
  local_68._16_8_ = (pointer)0x0;
  Instruction::Instruction
            (pIVar3,pIVar1,OpLabel,0,res_id,
             (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_68);
  pBVar2->function_ = (Function *)0x0;
  (pBVar2->label_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = pIVar3;
  pIVar3 = &(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_003d7c30;
  (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.unique_id_ = 0;
  (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.context_ =
       (IRContext *)0x0;
  *(undefined8 *)
   ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.context_ + 6)
       = 0;
  (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_line_insts_.
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           dbg_line_insts_.
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           dbg_line_insts_.
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.
  lexical_scope_ = 0;
  (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.inlined_at_
       = 0;
  (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = pIVar3;
  (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = pIVar3;
  (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = true;
  (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>._vptr_IntrusiveList =
       (_func_int **)&PTR__InstructionList_003d7cc8;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_68);
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  analysis::DefUseManager::AnalyzeInstDefUse
            ((pIVar1->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
             (pBVar2->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
  pIVar1 = (this->super_Pass).context_;
  local_68._0_8_ =
       (pBVar2->label_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if ((pIVar1->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
    ppBVar4 = std::__detail::
              _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&pIVar1->instr_to_block_,(key_type *)local_68);
    *ppBVar4 = pBVar2;
  }
  return pBVar2;
}

Assistant:

BasicBlock* ReplaceDescArrayAccessUsingVarIndex::CreateNewBlock() const {
  auto* new_block = new BasicBlock(std::unique_ptr<Instruction>(new Instruction(
      context(), spv::Op::OpLabel, 0, context()->TakeNextId(), {})));
  get_def_use_mgr()->AnalyzeInstDefUse(new_block->GetLabelInst());
  context()->set_instr_block(new_block->GetLabelInst(), new_block);
  return new_block;
}